

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.h
# Opt level: O1

ChFrame<double> * __thiscall
chrono::ChLinkMarkers::GetVisualModelFrame
          (ChFrame<double> *__return_storage_ptr__,ChLinkMarkers *this,uint nclone)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  lVar1 = *(long *)(this + 0xc0);
  __return_storage_ptr__->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_00119010;
  (__return_storage_ptr__->coord).pos.m_data[0] = *(double *)(lVar1 + 0x250);
  (__return_storage_ptr__->coord).pos.m_data[1] = *(double *)(lVar1 + 600);
  (__return_storage_ptr__->coord).pos.m_data[2] = *(double *)(lVar1 + 0x260);
  (__return_storage_ptr__->coord).rot.m_data[0] = *(double *)(lVar1 + 0x268);
  (__return_storage_ptr__->coord).rot.m_data[1] = *(double *)(lVar1 + 0x270);
  (__return_storage_ptr__->coord).rot.m_data[2] = *(double *)(lVar1 + 0x278);
  (__return_storage_ptr__->coord).rot.m_data[3] = *(double *)(lVar1 + 0x280);
  dVar2 = *(double *)(lVar1 + 0x290);
  dVar3 = *(double *)(lVar1 + 0x298);
  dVar4 = *(double *)(lVar1 + 0x2a0);
  dVar5 = *(double *)(lVar1 + 0x2a8);
  dVar6 = *(double *)(lVar1 + 0x2b0);
  dVar7 = *(double *)(lVar1 + 0x2b8);
  dVar8 = *(double *)(lVar1 + 0x2c0);
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       *(double *)(lVar1 + 0x288);
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar2;
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar3;
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar4;
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar5;
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar6;
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar7;
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] = dVar8;
  (__return_storage_ptr__->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       *(double *)(lVar1 + 0x2c8);
  return __return_storage_ptr__;
}

Assistant:

virtual ChFrame<> GetVisualModelFrame(unsigned int nclone = 0) override { return marker2->GetAbsFrame(); }